

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

void __thiscall leveldb::Table::ReadMeta(Table *this,Footer *footer)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  Block *this_00;
  Slice *extraout_RDX;
  Footer *in_RSI;
  long *in_RDI;
  string key;
  Iterator *iter;
  Block *meta;
  BlockHandle *in_stack_000000d0;
  BlockContents contents;
  ReadOptions opt;
  string *in_stack_fffffffffffffee8;
  Slice *in_stack_fffffffffffffef0;
  Block *pBVar4;
  BlockContents *in_stack_fffffffffffffef8;
  Iterator *x;
  bool local_e1;
  allocator<char> *__a;
  undefined7 in_stack_ffffffffffffff30;
  Slice *in_stack_ffffffffffffff68;
  Table *in_stack_ffffffffffffff70;
  allocator<char> local_79;
  string local_78 [32];
  Iterator *local_58;
  Block *local_50;
  Status local_48 [4];
  ReadOptions local_28;
  Footer *local_10;
  
  if (*(long *)(*in_RDI + 0x858) != 0) {
    local_10 = in_RSI;
    ReadOptions::ReadOptions(&local_28);
    if ((*(byte *)(*in_RDI + 10) & 1) != 0) {
      local_28.verify_checksums = true;
    }
    BlockContents::BlockContents((BlockContents *)0x138ae6);
    __a = *(allocator<char> **)(*in_RDI + 0x868);
    pBVar4 = (Block *)*in_RDI;
    Footer::metaindex_handle(local_10);
    ReadBlock((RandomAccessFile *)contents._16_8_,(Options *)contents.data.size_,
              (ReadOptions *)contents.data.data_,in_stack_000000d0,(BlockContents *)meta);
    bVar1 = Status::ok(local_48);
    bVar2 = bVar1 ^ 0xff;
    Status::~Status((Status *)in_stack_fffffffffffffef0);
    if ((bVar2 & 1) == 0) {
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,in_stack_fffffffffffffef8);
      local_50 = this_00;
      BytewiseComparator();
      local_58 = Block::NewIterator(pBVar4,(Comparator *)__a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar2,in_stack_ffffffffffffff30),(char *)pBVar4,__a);
      std::allocator<char>::~allocator(&local_79);
      (**(code **)(**(long **)(*in_RDI + 0x858) + 0x10))();
      std::__cxx11::string::append((char *)local_78);
      x = local_58;
      Slice::Slice(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      (*x->_vptr_Iterator[5])(x,&stack0xffffffffffffff70);
      uVar3 = (*local_58->_vptr_Iterator[2])();
      local_e1 = false;
      if ((uVar3 & 1) != 0) {
        (*local_58->_vptr_Iterator[8])();
        in_stack_ffffffffffffff68 = extraout_RDX;
        Slice::Slice(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        local_e1 = leveldb::operator==((Slice *)x,(Slice *)this_00);
      }
      if (local_e1 != false) {
        (*local_58->_vptr_Iterator[9])();
        ReadFilter(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      if (local_58 != (Iterator *)0x0) {
        (*local_58->_vptr_Iterator[1])();
      }
      if (local_50 != (Block *)0x0) {
        pBVar4 = local_50;
        Block::~Block(local_50);
        operator_delete(pBVar4,0x18);
      }
      std::__cxx11::string::~string(local_78);
    }
  }
  return;
}

Assistant:

void Table::ReadMeta(const Footer& footer) {
  if (rep_->options.filter_policy == nullptr) {
    return;  // Do not need any metadata
  }

  // TODO(sanjay): Skip this if footer.metaindex_handle() size indicates
  // it is an empty block.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents contents;
  if (!ReadBlock(rep_->file, rep_->options, opt, footer.metaindex_handle(), &contents).ok()) {
    // Do not propagate errors since meta info is not needed for operation
    return;
  }
  Block* meta = new Block(contents);

  Iterator* iter = meta->NewIterator(BytewiseComparator());
  std::string key = "filter.";
  key.append(rep_->options.filter_policy->Name());
  iter->Seek(key);
  if (iter->Valid() && iter->key() == Slice(key)) {
    ReadFilter(iter->value());
  }
  delete iter;
  delete meta;
}